

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O0

void re2::SetUnanchoredDollar(void)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  LogMessage local_9c0;
  LogMessage local_840;
  LogMessage local_6c0;
  StringPiece local_540;
  undefined1 local_530 [8];
  vector<int,_std::allocator<int>_> v;
  StringPiece local_398;
  LogMessage local_388;
  LogMessage local_208;
  StringPiece local_78;
  Options local_68;
  undefined1 local_50 [8];
  Set s;
  
  RE2::Options::Options(&local_68,DefaultOptions);
  RE2::Set::Set((Set *)local_50,&local_68,UNANCHORED);
  StringPiece::StringPiece(&local_78,"foo$");
  iVar2 = RE2::Set::Add((Set *)local_50,&local_78,(string *)0x0);
  if (iVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x4d);
    poVar5 = LogMessage::stream(&local_208);
    std::operator<<(poVar5,"Check failed: (s.Add(\"foo$\", __null)) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_208);
  }
  bVar1 = RE2::Set::Compile((Set *)local_50);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x4e);
    poVar5 = LogMessage::stream(&local_388);
    std::operator<<(poVar5,"Check failed: (s.Compile()) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_388);
  }
  StringPiece::StringPiece(&local_398,"foo");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_398,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)
               &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x50);
    poVar5 = LogMessage::stream((LogMessage *)
                                &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar5,"Check failed: (s.Match(\"foo\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_530);
  StringPiece::StringPiece(&local_540,"foo");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_540,(vector<int,_std::allocator<int>_> *)local_530)
  ;
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_6c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x53);
    poVar5 = LogMessage::stream(&local_6c0);
    std::operator<<(poVar5,"Check failed: (s.Match(\"foo\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6c0);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_530);
  if (sVar3 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_840,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x54);
    poVar5 = LogMessage::stream(&local_840);
    std::operator<<(poVar5,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_840);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_530,0);
  if (*pvVar4 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x55);
    poVar5 = LogMessage::stream(&local_9c0);
    std::operator<<(poVar5,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_9c0);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_530);
  RE2::Set::~Set((Set *)local_50);
  return;
}

Assistant:

TEST(Set, UnanchoredDollar) {
  RE2::Set s(RE2::DefaultOptions, RE2::UNANCHORED);

  CHECK_EQ(s.Add("foo$", NULL), 0);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("foo", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("foo", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);
}